

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoadStoreChecks.cpp
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_16b72::InstrumentMemoryAccesses::runOnFunction
          (InstrumentMemoryAccesses *this,Function *F)

{
  IntegerType *pIVar1;
  atomic<bool> aVar2;
  uint uVar3;
  Function *pFVar4;
  DataLayout *pDVar5;
  long lVar6;
  ulong uVar7;
  Value *pVVar8;
  Function *Check;
  Function *pFVar9;
  Instruction *I;
  StringRef SVar10;
  StringRef SVar11;
  TypeSize TVar12;
  TypeSize local_d8;
  Function *local_c8;
  Function *local_c0;
  undefined1 local_b8 [128];
  code *local_38;
  
  SVar10.Length = (size_t)"__loadcheck";
  SVar10.Data = *(char **)(F + 0x28);
  pFVar4 = (Function *)llvm::Module::getFunction(SVar10);
  this->LoadCheckFunction = pFVar4;
  if (pFVar4 == (Function *)0x0) {
LAB_00105f83:
    __assert_fail("LoadCheckFunction && \"__loadcheck function has disappeared!\\n\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ZanderChang[P]dataflow-pass/dataflow/LoadStoreChecks.cpp"
                  ,0x55,
                  "virtual bool (anonymous namespace)::InstrumentMemoryAccesses::runOnFunction(Function &)"
                 );
  }
  SVar11.Length = (size_t)"__storecheck";
  SVar11.Data = *(char **)(F + 0x28);
  pFVar4 = (Function *)llvm::Module::getFunction(SVar11);
  this->StoreCheckFunction = pFVar4;
  if (pFVar4 == (Function *)0x0) {
    __assert_fail("StoreCheckFunction && \"__storecheck function has disappeared!\\n\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ZanderChang[P]dataflow-pass/dataflow/LoadStoreChecks.cpp"
                  ,0x58,
                  "virtual bool (anonymous namespace)::InstrumentMemoryAccesses::runOnFunction(Function &)"
                 );
  }
  pDVar5 = (DataLayout *)llvm::Module::getDataLayout();
  this->TD = pDVar5;
  local_b8._64_8_ = llvm::Function::getContext();
  local_b8._72_8_ = local_b8 + 0x78;
  local_b8._80_8_ = &local_38;
  local_b8._0_8_ = local_b8 + 0x10;
  Check = (Function *)0x0;
  local_b8._8_4_ = 0;
  local_b8._12_4_ = 2;
  local_b8._88_8_ = (MDNode *)0x0;
  local_b8._96_4_ = 0;
  local_b8[100] = false;
  local_b8[0x65] = ebStrict;
  local_b8[0x66] = Dynamic;
  local_b8._48_8_ = (BasicBlock *)0x0;
  local_b8._56_8_ = (node_pointer)0x0;
  local_b8._104_8_ = (OperandBundleDefT<llvm::Value_*> *)0x0;
  local_b8._112_8_ = 0;
  local_b8._120_8_ = llvm::Module::getDataLayout;
  local_38 = llvm::Pass::getAsImmutablePass;
  this->Builder = (IRBuilder<llvm::ConstantFolder,_llvm::IRBuilderDefaultInserter> *)local_b8;
  pFVar4 = *(Function **)(F + 0x50);
  pFVar9 = F + 0x48;
  if (pFVar4 == F + 0x48) {
LAB_00105f29:
    llvm::IRBuilderDefaultInserter::~IRBuilderDefaultInserter((IRBuilderDefaultInserter *)&local_38)
    ;
    llvm::IRBuilderFolder::~IRBuilderFolder((IRBuilderFolder *)(local_b8 + 0x78));
    if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
      free((void *)local_b8._0_8_);
    }
    return true;
  }
LAB_00105cb3:
  local_c8 = pFVar9;
  pFVar9 = pFVar4 + -0x18;
  if (pFVar4 == (Function *)0x0) {
    pFVar9 = (Function *)0x0;
  }
  local_c0 = *(Function **)(pFVar4 + 8);
  pFVar4 = *(Function **)(pFVar9 + 0x30);
switchD_00105d01_caseD_1c:
  if (pFVar4 == pFVar9 + 0x28) goto LAB_00105f16;
  I = (Instruction *)(pFVar4 + -0x18);
  if (pFVar4 == (Function *)0x0) {
    I = (Instruction *)0x0;
  }
  if (0x42 < (byte)I[0x10] - 0x1c) {
    llvm::llvm_unreachable_internal
              ((llvm *)"Unknown instruction type encountered!",
               "/usr/lib/llvm-14/include/llvm/IR/InstVisitor.h",(char *)0x79,(uint)Check);
    goto LAB_00105f83;
  }
  pFVar4 = *(Function **)(pFVar4 + 8);
  switch((uint)(byte)I[0x10]) {
  default:
    goto switchD_00105d01_caseD_1c;
  case 0x3b:
    pIVar1 = this->SizeTy;
    TVar12 = llvm::DataLayout::getTypeSizeInBits(this->TD,*(Type **)I);
    local_d8.super_LinearPolySize<llvm::TypeSize>.super_UnivariateLinearPolyBase<llvm::TypeSize>.
    Value = TVar12.super_LinearPolySize<llvm::TypeSize>.
            super_UnivariateLinearPolyBase<llvm::TypeSize>.Value + 7 >> 3;
    local_d8.super_LinearPolySize<llvm::TypeSize>.super_UnivariateLinearPolyBase<llvm::TypeSize>.
    UnivariateDim =
         (uint)(TVar12.super_LinearPolySize<llvm::TypeSize>.
                super_UnivariateLinearPolyBase<llvm::TypeSize>.UnivariateDim == 1);
    uVar7 = llvm::TypeSize::operator_cast_to_unsigned_long(&local_d8);
    pVVar8 = (Value *)llvm::ConstantInt::get(pIVar1,uVar7,false);
    Check = this->LoadCheckFunction;
    instrument(this,*(Value **)(I + -0x20),pVVar8,Check,I);
    LOCK();
    LoadsInstrumented.Value.super___atomic_base<unsigned_int>._M_i =
         (__atomic_base<unsigned_int>)
         ((int)LoadsInstrumented.Value.super___atomic_base<unsigned_int>._M_i + 1);
    UNLOCK();
    aVar2 = LoadsInstrumented.Initialized;
    break;
  case 0x3c:
    TVar12 = llvm::DataLayout::getTypeSizeInBits(this->TD,(Type *)**(undefined8 **)(I + -0x40));
    local_d8.super_LinearPolySize<llvm::TypeSize>.super_UnivariateLinearPolyBase<llvm::TypeSize>.
    Value = TVar12.super_LinearPolySize<llvm::TypeSize>.
            super_UnivariateLinearPolyBase<llvm::TypeSize>.Value + 7 >> 3;
    local_d8.super_LinearPolySize<llvm::TypeSize>.super_UnivariateLinearPolyBase<llvm::TypeSize>.
    UnivariateDim =
         (uint)(TVar12.super_LinearPolySize<llvm::TypeSize>.
                super_UnivariateLinearPolyBase<llvm::TypeSize>.UnivariateDim == 1);
    uVar7 = llvm::TypeSize::operator_cast_to_unsigned_long(&local_d8);
    pVVar8 = (Value *)llvm::ConstantInt::get(this->SizeTy,uVar7,false);
    Check = this->StoreCheckFunction;
    instrument(this,*(Value **)(I + -0x20),pVVar8,Check,I);
    LOCK();
    StoresInstrumented.Value.super___atomic_base<unsigned_int>._M_i =
         (__atomic_base<unsigned_int>)
         ((int)StoresInstrumented.Value.super___atomic_base<unsigned_int>._M_i + 1);
    UNLOCK();
    aVar2 = StoresInstrumented.Initialized;
    break;
  case 0x3f:
    pIVar1 = this->SizeTy;
    TVar12 = llvm::DataLayout::getTypeSizeInBits(this->TD,*(Type **)I);
    local_d8.super_LinearPolySize<llvm::TypeSize>.super_UnivariateLinearPolyBase<llvm::TypeSize>.
    Value = TVar12.super_LinearPolySize<llvm::TypeSize>.
            super_UnivariateLinearPolyBase<llvm::TypeSize>.Value + 7 >> 3;
    local_d8.super_LinearPolySize<llvm::TypeSize>.super_UnivariateLinearPolyBase<llvm::TypeSize>.
    UnivariateDim =
         (uint)(TVar12.super_LinearPolySize<llvm::TypeSize>.
                super_UnivariateLinearPolyBase<llvm::TypeSize>.UnivariateDim == 1);
    uVar7 = llvm::TypeSize::operator_cast_to_unsigned_long(&local_d8);
    pVVar8 = (Value *)llvm::ConstantInt::get(pIVar1,uVar7,false);
    Check = this->StoreCheckFunction;
    instrument(this,*(Value **)(I + -0x60),pVVar8,Check,I);
    goto LAB_00105e39;
  case 0x40:
    pIVar1 = this->SizeTy;
    TVar12 = llvm::DataLayout::getTypeSizeInBits(this->TD,*(Type **)I);
    local_d8.super_LinearPolySize<llvm::TypeSize>.super_UnivariateLinearPolyBase<llvm::TypeSize>.
    Value = TVar12.super_LinearPolySize<llvm::TypeSize>.
            super_UnivariateLinearPolyBase<llvm::TypeSize>.Value + 7 >> 3;
    local_d8.super_LinearPolySize<llvm::TypeSize>.super_UnivariateLinearPolyBase<llvm::TypeSize>.
    UnivariateDim =
         (uint)(TVar12.super_LinearPolySize<llvm::TypeSize>.
                super_UnivariateLinearPolyBase<llvm::TypeSize>.UnivariateDim == 1);
    uVar7 = llvm::TypeSize::operator_cast_to_unsigned_long(&local_d8);
    pVVar8 = (Value *)llvm::ConstantInt::get(pIVar1,uVar7,false);
    Check = this->StoreCheckFunction;
    instrument(this,*(Value **)(I + -0x40),pVVar8,Check,I);
LAB_00105e39:
    LOCK();
    AtomicsInstrumented.Value.super___atomic_base<unsigned_int>._M_i =
         (__atomic_base<unsigned_int>)
         ((int)AtomicsInstrumented.Value.super___atomic_base<unsigned_int>._M_i + 1);
    UNLOCK();
    aVar2._M_base._M_i = AtomicsInstrumented.Initialized._M_base._M_i;
    break;
  case 0x53:
    lVar6 = *(long *)(I + -0x20);
    if (lVar6 == 0) {
      lVar6 = 0;
    }
    else {
      Check = (Function *)0x0;
      if (*(char *)(lVar6 + 0x10) != '\0') {
        lVar6 = 0;
      }
    }
    if ((lVar6 == 0) || (Check = *(Function **)(lVar6 + 0x18), Check != *(Function **)(I + 0x48))) {
      lVar6 = 0;
    }
    if (lVar6 != 0) {
      Check = (Function *)0xffffff41;
      uVar3 = *(int *)(lVar6 + 0x24) - 0xbf;
      if ((uVar3 < 6) && (Check = (Function *)0x29, (0x29U >> (uVar3 & 0x1f) & 1) != 0)) {
        visitMemIntrinsic(this,(MemIntrinsic *)I);
      }
    }
    goto switchD_00105d01_caseD_1c;
  }
  if (((byte)aVar2._M_base._M_i & 1) == 0) {
    llvm::TrackingStatistic::RegisterStatistic();
  }
  goto switchD_00105d01_caseD_1c;
LAB_00105f16:
  pFVar4 = local_c0;
  pFVar9 = local_c8;
  if (local_c0 == local_c8) goto LAB_00105f29;
  goto LAB_00105cb3;
}

Assistant:

bool InstrumentMemoryAccesses::runOnFunction(Function &F) {
    // Check that the load and store check functions are declared.
    LoadCheckFunction = F.getParent()->getFunction("__loadcheck");
    assert(LoadCheckFunction && "__loadcheck function has disappeared!\n");

    StoreCheckFunction = F.getParent()->getFunction("__storecheck");
    assert(StoreCheckFunction && "__storecheck function has disappeared!\n");

    TD = &F.getParent()->getDataLayout();
    IRBuilder<> TheBuilder(F.getContext());
    Builder = &TheBuilder;

    // Visit all of the instructions in the function.
    visit(F);
    return true;
}